

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  bool bVar1;
  long lVar2;
  long lVar3;
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  string local_1d8 [32];
  size_t local_1b8;
  size_t sStack_1b0;
  allocator<char> local_199;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  string local_188 [32];
  size_t local_168;
  size_t sStack_160;
  allocator<char> local_149;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  string local_138 [32];
  size_t local_118;
  size_t sStack_110;
  allocator<char> local_f9;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  string local_e8 [32];
  size_t local_c8;
  size_t sStack_c0;
  allocator<char> local_a9;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98 [32];
  size_t local_78;
  size_t sStack_70;
  undefined1 auStack_60 [8];
  string_view versionPart;
  long local_30;
  size_t pos;
  string *dependence_local;
  DependenceStruct *this_local;
  
  std::__cxx11::string::string((string *)this);
  CompareStruct::CompareStruct(&this->Compare);
  local_30 = std::__cxx11::string::find((char)dependence,0x3a);
  if (local_30 == -1) {
    local_30 = std::__cxx11::string::find((char)dependence,0x2d);
  }
  if (local_30 == -1) {
    std::__cxx11::string::operator=((string *)this,(string *)dependence);
  }
  else {
    std::__cxx11::string::substr((ulong)&versionPart._M_str,(ulong)dependence);
    std::__cxx11::string::operator=((string *)this,(string *)&versionPart._M_str);
    std::__cxx11::string::~string((string *)&versionPart._M_str);
    local_30 = local_30 + 1;
    lVar2 = std::__cxx11::string::size();
    if (local_30 != lVar2) {
      lVar2 = std::__cxx11::string::data();
      lVar3 = std::__cxx11::string::size();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                 (char *)(lVar2 + local_30),lVar3 - local_30);
      local_78 = (size_t)auStack_60;
      sStack_70 = versionPart._M_len;
      str_03._M_str = (char *)versionPart._M_len;
      str_03._M_len = (size_t)auStack_60;
      bVar1 = cmHasLiteralPrefix<3ul>(str_03,(char (*) [3])"<=");
      if (bVar1) {
        (this->Compare).Type = 3;
        local_a8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,2,
                              0xffffffffffffffff);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_98,&local_a8,&local_a9);
        std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_98);
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator(&local_a9);
      }
      else {
        local_c8 = (size_t)auStack_60;
        sStack_c0 = versionPart._M_len;
        str_02._M_str = (char *)versionPart._M_len;
        str_02._M_len = (size_t)auStack_60;
        bVar1 = cmHasLiteralPrefix<3ul>(str_02,(char (*) [3])0x107d26a);
        if (bVar1) {
          (this->Compare).Type = 5;
          local_f8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,2,
                                0xffffffffffffffff);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_e8,&local_f8,&local_f9);
          std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_e8);
          std::__cxx11::string::~string(local_e8);
          std::allocator<char>::~allocator(&local_f9);
        }
        else {
          local_118 = (size_t)auStack_60;
          sStack_110 = versionPart._M_len;
          str_01._M_str = (char *)versionPart._M_len;
          str_01._M_len = (size_t)auStack_60;
          bVar1 = cmHasPrefix(str_01,'<');
          if (bVar1) {
            (this->Compare).Type = 2;
            local_148 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,1,
                                   0xffffffffffffffff);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      (local_138,&local_148,&local_149);
            std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_138);
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator(&local_149);
          }
          else {
            local_168 = (size_t)auStack_60;
            sStack_160 = versionPart._M_len;
            str_00._M_str = (char *)versionPart._M_len;
            str_00._M_len = (size_t)auStack_60;
            bVar1 = cmHasPrefix(str_00,'=');
            if (bVar1) {
              (this->Compare).Type = 1;
              local_198 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                                     1,0xffffffffffffffff);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        (local_188,&local_198,&local_199);
              std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_188);
              std::__cxx11::string::~string(local_188);
              std::allocator<char>::~allocator(&local_199);
            }
            else {
              local_1b8 = (size_t)auStack_60;
              sStack_1b0 = versionPart._M_len;
              str._M_str = (char *)versionPart._M_len;
              str._M_len = (size_t)auStack_60;
              bVar1 = cmHasPrefix(str,'>');
              if (bVar1) {
                (this->Compare).Type = 4;
                local_1e8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       auStack_60,1,0xffffffffffffffff);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          (local_1d8,&local_1e8,&local_1e9);
                std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_1d8);
                std::__cxx11::string::~string(local_1d8);
                std::allocator<char>::~allocator(&local_1e9);
              }
              else {
                (this->Compare).Type = 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          (local_210,(basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
                           &local_211);
                std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_210);
                std::__cxx11::string::~string(local_210);
                std::allocator<char>::~allocator(&local_211);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Preferred format is name and version are separated by a colon (:), but
  // note that this is only supported with QtIFW 3.1 or later. Backward
  // compatibility allows a hyphen (-) as a separator instead, but names then
  // cannot contain a hyphen.
  size_t pos;
  if ((pos = dependence.find(':')) == std::string::npos) {
    pos = dependence.find('-');
  }

  if (pos != std::string::npos) {
    this->Name = dependence.substr(0, pos);
    ++pos;
    if (pos == dependence.size()) {
      // Nothing after the separator. Treat this as no version constraint.
      return;
    }

    const auto versionPart =
      cm::string_view(dependence.data() + pos, dependence.size() - pos);

    if (cmHasLiteralPrefix(versionPart, "<=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasLiteralPrefix(versionPart, ">=")) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
      this->Compare.Value = std::string(versionPart.substr(2));
    } else if (cmHasPrefix(versionPart, '<')) {
      this->Compare.Type = cmCPackIFWPackage::CompareLess;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '=')) {
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else if (cmHasPrefix(versionPart, '>')) {
      this->Compare.Type = cmCPackIFWPackage::CompareGreater;
      this->Compare.Value = std::string(versionPart.substr(1));
    } else {
      // We found no operator but a version specification is still expected to
      // follow. The default behavior is to treat this the same as =. We
      // explicitly record that as our type (it simplifies our logic a little
      // and is also clearer).
      this->Compare.Type = cmCPackIFWPackage::CompareEqual;
      this->Compare.Value = std::string(versionPart);
    }
  } else {
    this->Name = dependence;
  }
}